

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

error_code wave::make_error_code(Error err)

{
  error_category *peVar1;
  undefined8 uVar2;
  error_code eVar3;
  
  switch(err) {
  case kFailedToOpen:
  case kWriteError:
  case kReadError:
    uVar2 = 5;
    break;
  case kNotOpen:
    uVar2 = 1;
    break;
  case kInvalidFormat:
    uVar2 = 8;
    break;
  default:
    uVar2 = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    goto LAB_00122e9c;
  }
  peVar1 = (error_category *)std::_V2::generic_category();
LAB_00122e9c:
  eVar3._M_cat = peVar1;
  eVar3._0_8_ = uVar2;
  return eVar3;
}

Assistant:

std::error_code make_error_code(Error err) {
  switch (err) {
    case kFailedToOpen:
      return std::make_error_code(std::errc::io_error);
    case kNotOpen:
      return std::make_error_code(std::errc::operation_not_permitted);
    case kInvalidFormat:
      return std::make_error_code(std::errc::executable_format_error);
    case kWriteError:
      return std::make_error_code(std::errc::io_error);
    case kReadError:
      return std::make_error_code(std::errc::io_error);
    default:
      return std::error_code();
  }
}